

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnvmbcs.cpp
# Opt level: O2

void ucnv_SBCSFromUTF8(UConverterFromUnicodeArgs *pFromUArgs,UConverterToUnicodeArgs *pToUArgs,
                      UErrorCode *pErrorCode)

{
  byte bVar1;
  byte *pbVar2;
  UBool UVar3;
  byte bVar4;
  ushort uVar5;
  UChar32 UVar6;
  undefined8 in_RAX;
  ulong uVar7;
  UErrorCode UVar8;
  uint8_t *puVar9;
  undefined7 uVar10;
  uint uVar11;
  UConverter *pUVar12;
  ulong uVar13;
  long lVar14;
  int iVar15;
  uint uVar16;
  UConverter *pUVar17;
  byte *pbVar18;
  byte *pbVar19;
  uint32_t prev;
  uint uVar20;
  bool bVar21;
  uint8_t *target;
  uint local_a8;
  uint local_a4;
  byte *local_a0;
  UConverterToUnicodeArgs *local_98;
  uint local_8c;
  UConverterFromUnicodeArgs *local_88;
  long local_80;
  UConverterSharedData *local_78;
  UErrorCode *local_70;
  uint local_68;
  uint32_t local_64;
  ulong local_60;
  byte *local_58;
  UConverter *local_50;
  UConverter *local_48;
  uint16_t *local_40;
  UChar *noSource;
  
  pUVar17 = pToUArgs->converter;
  pbVar18 = (byte *)pToUArgs->source;
  pUVar12 = pFromUArgs->converter;
  target = (uint8_t *)pFromUArgs->target;
  local_a0 = (byte *)pToUArgs->sourceLimit;
  uVar13 = CONCAT71((int7)((ulong)in_RAX >> 8),(char)pUVar12->options) & 0xffffffffffffff10;
  uVar7 = CONCAT71((int7)(uVar13 >> 8),pUVar17->toULength);
  if (pUVar17->toULength < '\x01') {
    local_a8 = 0;
    prev = 0;
    uVar7 = 0;
  }
  else {
    local_a8 = (uint)CONCAT71((int7)((ulong)pFromUArgs >> 8),(char)pUVar17->mode);
    prev = pUVar17->toUnicodeStatus;
  }
  local_78 = pUVar12->sharedData;
  iVar15 = (((uint)uVar7 & 0xff) - (int)(char)local_a8) + ((int)local_a0 - (int)pbVar18);
  if ((0 < iVar15) && (bVar1 = local_a0[-1], (char)bVar1 < '\0')) {
    if ((iVar15 == 1) || (0xbf < bVar1)) {
      if ((byte)(bVar1 + 0x3e) < 0x2e) {
        local_a0 = local_a0 + -1;
      }
    }
    else if (((local_a0[-2] & 0xf0) == 0xe0) &&
            (((byte)" 000000000000\x1000"[local_a0[-2] & 0xf] >> (bVar1 >> 5) & 1) != 0)) {
      local_a0 = local_a0 + -2;
    }
  }
  uVar16 = *(int *)&pFromUArgs->targetLimit - (int)target;
  local_40 = (local_78->mbcs).fromUnicodeTable;
  local_80 = *(long *)((local_78->mbcs).sbcsIndex + (uVar13 >> 4 & 0xf) * 4 + 0x40);
  local_64 = (local_78->mbcs).asciiRoundtrips;
  local_a4 = ((pUVar12->useFallback == '\0') + 2) * 0x400;
  bVar1 = (local_78->mbcs).unicodeMask;
  puVar9 = (uint8_t *)CONCAT71((int7)((ulong)local_78 >> 8),bVar1);
  pbVar19 = pbVar18;
  local_98 = pToUArgs;
  if (prev == 0) goto LAB_00328ebd;
  if ((int)uVar16 < 1) goto LAB_00328ebd;
  pUVar17->toUnicodeStatus = 0;
  pUVar17->toULength = '\0';
  uVar13 = uVar7 & 0xffffffff;
LAB_00328c8e:
  local_8c = (uint)uVar13;
  iVar15 = (int)(char)local_a8;
  local_68 = local_a8 & 0xff;
  uVar13 = uVar7 & 0xff;
  local_88 = pFromUArgs;
  local_70 = pErrorCode;
  local_60 = uVar13;
  local_58 = pbVar18;
  local_50 = pUVar12;
  local_48 = pUVar17;
  if ((char)local_a8 <= (char)uVar7) {
    local_68 = (uint)uVar13;
  }
  for (; uVar20 = (uint)uVar13, uVar11 = local_68, (int)uVar20 < iVar15; uVar13 = uVar13 + 1) {
    if (local_98->sourceLimit <= pbVar18) {
      for (uVar7 = (ulong)(byte)local_8c; uVar7 < uVar13; uVar7 = uVar7 + 1) {
        local_48->toUBytes[uVar7] = local_58[uVar7 - local_60];
      }
      local_48->toUnicodeStatus = prev;
      local_48->toULength = (int8_t)uVar13;
      local_48->mode = iVar15;
      local_98->source = (char *)(local_58 + (uVar7 - local_60));
      local_88->target = (char *)target;
      return;
    }
    bVar4 = *pbVar18;
    UVar3 = icu_63::UTF8::isValidTrail(prev,bVar4,uVar20,iVar15);
    uVar11 = uVar20;
    if (UVar3 == '\0') break;
    pbVar18 = pbVar18 + 1;
    prev = prev * 0x40 + (uint)bVar4;
  }
  if ((char)uVar11 != (char)local_a8) {
    for (uVar13 = (ulong)(local_8c & 0xff); uVar13 < (uVar11 & 0xff); uVar13 = uVar13 + 1) {
      local_48->toUBytes[uVar13] = local_58[uVar13 - local_60];
    }
    local_48->toULength = (char)uVar11;
    local_98->source = (char *)(local_58 + (uVar13 - local_60));
    local_88->target = (char *)target;
    *local_70 = U_ILLEGAL_CHAR_FOUND;
    return;
  }
  prev = prev - utf8_offsets[iVar15];
  pFromUArgs = local_88;
  pUVar12 = local_50;
  pUVar17 = local_48;
  pErrorCode = local_70;
  if (((char)local_a8 < '\x04') || (uVar5 = 0, (bVar1 & 1) != 0)) {
    uVar5 = *(ushort *)
             (local_80 +
             (ulong)((prev & 0xf) +
                    (uint)local_40[(prev >> 4 & 0x3f) + (uint)local_40[(int)prev >> 10]]) * 2);
  }
LAB_00328dda:
  if (local_a4 <= uVar5) goto LAB_00328faf;
  noSource = L"";
  UVar6 = _extFromU(pUVar12,pUVar12->sharedData,prev,&noSource,L"",&target,target + uVar16,
                    (int32_t **)0x0,-1,pFromUArgs->flush,pErrorCode);
  UVar8 = *pErrorCode;
  puVar9 = (uint8_t *)(ulong)(uint)UVar8;
  if (UVar8 < U_ILLEGAL_ARGUMENT_ERROR) {
    if (pUVar12->preFromUFirstCP < 0) {
      uVar16 = *(int *)&pFromUArgs->targetLimit - (int)target;
      pbVar19 = pbVar18;
LAB_00328ebd:
      do {
        if (local_a0 <= pbVar19) {
          UVar8 = *pErrorCode;
          pbVar18 = pbVar19;
          goto LAB_00328fca;
        }
        if ((int)uVar16 < 1) {
          *pErrorCode = U_BUFFER_OVERFLOW_ERROR;
          goto LAB_00329005;
        }
        pbVar18 = pbVar19 + 1;
        bVar4 = *pbVar19;
        uVar10 = (undefined7)((ulong)puVar9 >> 8);
        prev = (uint32_t)bVar4;
        if ((char)bVar4 < '\0') {
          if (bVar4 < 0xe0) {
            if (bVar4 < 0xc2) {
LAB_0032908f:
              local_a8 = 0;
              uVar7 = 1;
              uVar13 = 0;
              goto LAB_00328c8e;
            }
            uVar11 = *pbVar18 ^ 0x80;
            if (0x3f < (byte)uVar11) {
LAB_00329046:
              bVar21 = 0xdf < bVar4;
              bVar4 = 2;
LAB_0032904e:
              local_a8 = (uint)CONCAT71(uVar10,bVar21 + bVar4);
              uVar7 = 1;
              uVar13 = 0;
              goto LAB_00328c8e;
            }
            uVar20 = prev & 0x1f;
            pbVar18 = pbVar19 + 2;
            uVar5 = *(ushort *)(local_80 + (ulong)((local_78->mbcs).sbcsIndex[uVar20] + uVar11) * 2)
            ;
            if (uVar5 < (ushort)local_a4) {
LAB_003290a2:
              prev = uVar20 << 6 | uVar11;
              goto LAB_00328dda;
            }
          }
          else {
            if (bVar4 != 0xe0) {
              if ((byte)(bVar4 + 0x3e) < 0x33) {
                bVar4 = 0xef < bVar4 | 2;
                bVar21 = true;
                goto LAB_0032904e;
              }
              goto LAB_0032908f;
            }
            uVar13 = (ulong)*pbVar18 ^ 0x80;
            if ((((byte)uVar13 & 0xe0) != 0x20) || (uVar11 = pbVar19[2] ^ 0x80, 0x3f < (byte)uVar11)
               ) goto LAB_00329046;
            pbVar18 = pbVar19 + 3;
            uVar5 = *(ushort *)(local_80 + (ulong)((local_78->mbcs).sbcsIndex[uVar13] + uVar11) * 2)
            ;
            if (uVar5 < (ushort)local_a4) {
              uVar20 = (uint)uVar13;
              goto LAB_003290a2;
            }
          }
LAB_00328faf:
          *target = (uint8_t)uVar5;
          puVar9 = target;
        }
        else {
          if ((local_64 >> (bVar4 >> 2 & 0x1f) & 1) == 0) goto LAB_00329029;
          *target = bVar4;
          puVar9 = (uint8_t *)CONCAT71(uVar10,bVar4);
        }
        target = target + 1;
        uVar16 = uVar16 - 1;
        pbVar19 = pbVar18;
      } while( true );
    }
    *pErrorCode = U_USING_DEFAULT_WARNING;
    UVar8 = U_USING_DEFAULT_WARNING;
  }
  else {
    pUVar12->fromUChar32 = UVar6;
  }
LAB_00328fca:
  pbVar19 = pbVar18;
  if (((UVar8 < U_ILLEGAL_ARGUMENT_ERROR) && (pUVar12->preFromUFirstCP < 0)) &&
     (pbVar2 = (byte *)local_98->sourceLimit, pbVar18 < pbVar2)) {
    bVar1 = *pbVar18;
    uVar16 = (uint)bVar1;
    pUVar17->toUBytes[0] = bVar1;
    if ((char)bVar1 < '\0') {
      iVar15 = 0;
      if ((byte)(bVar1 + 0x3e) < 0x33) {
        iVar15 = ((uint)(0xdf < bVar1) - (uint)(bVar1 < 0xf0)) + 3;
      }
    }
    else {
      iVar15 = 1;
    }
    lVar14 = 1;
    while( true ) {
      pbVar19 = pbVar18 + lVar14;
      if (pbVar2 <= pbVar19) break;
      bVar1 = *pbVar19;
      pUVar17->toUBytes[(char)lVar14] = bVar1;
      uVar16 = uVar16 * 0x40 + (uint)bVar1;
      lVar14 = lVar14 + 1;
    }
    pUVar17->toUnicodeStatus = uVar16;
    pUVar17->toULength = (char)lVar14;
    pUVar17->mode = iVar15;
  }
LAB_00329005:
  local_98->source = (char *)pbVar19;
  pFromUArgs->target = (char *)target;
  return;
LAB_00329029:
  uVar5 = *(ushort *)(local_80 + (ulong)((local_78->mbcs).sbcsIndex[0] + prev) * 2);
  goto LAB_00328dda;
}

Assistant:

static void U_CALLCONV
ucnv_SBCSFromUTF8(UConverterFromUnicodeArgs *pFromUArgs,
                  UConverterToUnicodeArgs *pToUArgs,
                  UErrorCode *pErrorCode) {
    UConverter *utf8, *cnv;
    const uint8_t *source, *sourceLimit;
    uint8_t *target;
    int32_t targetCapacity;

    const uint16_t *table, *sbcsIndex;
    const uint16_t *results;

    int8_t oldToULength, toULength, toULimit;

    UChar32 c;
    uint8_t b, t1, t2;

    uint32_t asciiRoundtrips;
    uint16_t value, minValue = 0;
    UBool hasSupplementary;

    /* set up the local pointers */
    utf8=pToUArgs->converter;
    cnv=pFromUArgs->converter;
    source=(uint8_t *)pToUArgs->source;
    sourceLimit=(uint8_t *)pToUArgs->sourceLimit;
    target=(uint8_t *)pFromUArgs->target;
    targetCapacity=(int32_t)(pFromUArgs->targetLimit-pFromUArgs->target);

    table=cnv->sharedData->mbcs.fromUnicodeTable;
    sbcsIndex=cnv->sharedData->mbcs.sbcsIndex;
    if((cnv->options&UCNV_OPTION_SWAP_LFNL)!=0) {
        results=(uint16_t *)cnv->sharedData->mbcs.swapLFNLFromUnicodeBytes;
    } else {
        results=(uint16_t *)cnv->sharedData->mbcs.fromUnicodeBytes;
    }
    asciiRoundtrips=cnv->sharedData->mbcs.asciiRoundtrips;

    if(cnv->useFallback) {
        /* use all roundtrip and fallback results */
        minValue=0x800;
    } else {
        /* use only roundtrips and fallbacks from private-use characters */
        minValue=0xc00;
    }
    hasSupplementary=(UBool)(cnv->sharedData->mbcs.unicodeMask&UCNV_HAS_SUPPLEMENTARY);

    /* get the converter state from the UTF-8 UConverter */
    if(utf8->toULength > 0) {
        toULength=oldToULength=utf8->toULength;
        toULimit=(int8_t)utf8->mode;
        c=(UChar32)utf8->toUnicodeStatus;
    } else {
        toULength=oldToULength=toULimit=0;
        c = 0;
    }

    // The conversion loop checks source<sourceLimit only once per 1/2/3-byte character.
    // If the buffer ends with a truncated 2- or 3-byte sequence,
    // then we reduce the sourceLimit to before that,
    // and collect the remaining bytes after the conversion loop.
    {
        // Do not go back into the bytes that will be read for finishing a partial
        // sequence from the previous buffer.
        int32_t length=(int32_t)(sourceLimit-source) - (toULimit-oldToULength);
        if(length>0) {
            uint8_t b1=*(sourceLimit-1);
            if(U8_IS_SINGLE(b1)) {
                // common ASCII character
            } else if(U8_IS_TRAIL(b1) && length>=2) {
                uint8_t b2=*(sourceLimit-2);
                if(0xe0<=b2 && b2<0xf0 && U8_IS_VALID_LEAD3_AND_T1(b2, b1)) {
                    // truncated 3-byte sequence
                    sourceLimit-=2;
                }
            } else if(0xc2<=b1 && b1<0xf0) {
                // truncated 2- or 3-byte sequence
                --sourceLimit;
            }
        }
    }

    if(c!=0 && targetCapacity>0) {
        utf8->toUnicodeStatus=0;
        utf8->toULength=0;
        goto moreBytes;
        /*
         * Note: We could avoid the goto by duplicating some of the moreBytes
         * code, but only up to the point of collecting a complete UTF-8
         * sequence; then recurse for the toUBytes[toULength]
         * and then continue with normal conversion.
         *
         * If so, move this code to just after initializing the minimum
         * set of local variables for reading the UTF-8 input
         * (utf8, source, target, limits but not cnv, table, minValue, etc.).
         *
         * Potential advantages:
         * - avoid the goto
         * - oldToULength could become a local variable in just those code blocks
         *   that deal with buffer boundaries
         * - possibly faster if the goto prevents some compiler optimizations
         *   (this would need measuring to confirm)
         * Disadvantage:
         * - code duplication
         */
    }

    /* conversion loop */
    while(source<sourceLimit) {
        if(targetCapacity>0) {
            b=*source++;
            if(U8_IS_SINGLE(b)) {
                /* convert ASCII */
                if(IS_ASCII_ROUNDTRIP(b, asciiRoundtrips)) {
                    *target++=(uint8_t)b;
                    --targetCapacity;
                    continue;
                } else {
                    c=b;
                    value=SBCS_RESULT_FROM_UTF8(sbcsIndex, results, 0, c);
                }
            } else {
                if(b<0xe0) {
                    if( /* handle U+0080..U+07FF inline */
                        b>=0xc2 &&
                        (t1=(uint8_t)(*source-0x80)) <= 0x3f
                    ) {
                        c=b&0x1f;
                        ++source;
                        value=SBCS_RESULT_FROM_UTF8(sbcsIndex, results, c, t1);
                        if(value>=minValue) {
                            *target++=(uint8_t)value;
                            --targetCapacity;
                            continue;
                        } else {
                            c=(c<<6)|t1;
                        }
                    } else {
                        c=-1;
                    }
                } else if(b==0xe0) {
                    if( /* handle U+0800..U+0FFF inline */
                        (t1=(uint8_t)(source[0]-0x80)) <= 0x3f && t1 >= 0x20 &&
                        (t2=(uint8_t)(source[1]-0x80)) <= 0x3f
                    ) {
                        c=t1;
                        source+=2;
                        value=SBCS_RESULT_FROM_UTF8(sbcsIndex, results, c, t2);
                        if(value>=minValue) {
                            *target++=(uint8_t)value;
                            --targetCapacity;
                            continue;
                        } else {
                            c=(c<<6)|t2;
                        }
                    } else {
                        c=-1;
                    }
                } else {
                    c=-1;
                }

                if(c<0) {
                    /* handle "complicated" and error cases, and continuing partial characters */
                    oldToULength=0;
                    toULength=1;
                    toULimit=U8_COUNT_BYTES_NON_ASCII(b);
                    c=b;
moreBytes:
                    while(toULength<toULimit) {
                        /*
                         * The sourceLimit may have been adjusted before the conversion loop
                         * to stop before a truncated sequence.
                         * Here we need to use the real limit in case we have two truncated
                         * sequences at the end.
                         * See ticket #7492.
                         */
                        if(source<(uint8_t *)pToUArgs->sourceLimit) {
                            b=*source;
                            if(icu::UTF8::isValidTrail(c, b, toULength, toULimit)) {
                                ++source;
                                ++toULength;
                                c=(c<<6)+b;
                            } else {
                                break; /* sequence too short, stop with toULength<toULimit */
                            }
                        } else {
                            /* store the partial UTF-8 character, compatible with the regular UTF-8 converter */
                            source-=(toULength-oldToULength);
                            while(oldToULength<toULength) {
                                utf8->toUBytes[oldToULength++]=*source++;
                            }
                            utf8->toUnicodeStatus=c;
                            utf8->toULength=toULength;
                            utf8->mode=toULimit;
                            pToUArgs->source=(char *)source;
                            pFromUArgs->target=(char *)target;
                            return;
                        }
                    }

                    if(toULength==toULimit) {
                        c-=utf8_offsets[toULength];
                        if(toULength<=3) {  /* BMP */
                            value=MBCS_SINGLE_RESULT_FROM_U(table, results, c);
                        } else {
                            /* supplementary code point */
                            if(!hasSupplementary) {
                                /* BMP-only codepages are stored without stage 1 entries for supplementary code points */
                                value=0;
                            } else {
                                value=MBCS_SINGLE_RESULT_FROM_U(table, results, c);
                            }
                        }
                    } else {
                        /* error handling: illegal UTF-8 byte sequence */
                        source-=(toULength-oldToULength);
                        while(oldToULength<toULength) {
                            utf8->toUBytes[oldToULength++]=*source++;
                        }
                        utf8->toULength=toULength;
                        pToUArgs->source=(char *)source;
                        pFromUArgs->target=(char *)target;
                        *pErrorCode=U_ILLEGAL_CHAR_FOUND;
                        return;
                    }
                }
            }

            if(value>=minValue) {
                /* output the mapping for c */
                *target++=(uint8_t)value;
                --targetCapacity;
            } else {
                /* value<minValue means c is unassigned (unmappable) */
                /*
                 * Try an extension mapping.
                 * Pass in no source because we don't have UTF-16 input.
                 * If we have a partial match on c, we will return and revert
                 * to UTF-8->UTF-16->charset conversion.
                 */
                static const UChar nul=0;
                const UChar *noSource=&nul;
                c=_extFromU(cnv, cnv->sharedData,
                            c, &noSource, noSource,
                            &target, target+targetCapacity,
                            NULL, -1,
                            pFromUArgs->flush,
                            pErrorCode);

                if(U_FAILURE(*pErrorCode)) {
                    /* not mappable or buffer overflow */
                    cnv->fromUChar32=c;
                    break;
                } else if(cnv->preFromUFirstCP>=0) {
                    /*
                     * Partial match, return and revert to pivoting.
                     * In normal from-UTF-16 conversion, we would just continue
                     * but then exit the loop because the extension match would
                     * have consumed the source.
                     */
                    *pErrorCode=U_USING_DEFAULT_WARNING;
                    break;
                } else {
                    /* a mapping was written to the target, continue */

                    /* recalculate the targetCapacity after an extension mapping */
                    targetCapacity=(int32_t)(pFromUArgs->targetLimit-(char *)target);
                }
            }
        } else {
            /* target is full */
            *pErrorCode=U_BUFFER_OVERFLOW_ERROR;
            break;
        }
    }

    /*
     * The sourceLimit may have been adjusted before the conversion loop
     * to stop before a truncated sequence.
     * If so, then collect the truncated sequence now.
     */
    if(U_SUCCESS(*pErrorCode) &&
            cnv->preFromUFirstCP<0 &&
            source<(sourceLimit=(uint8_t *)pToUArgs->sourceLimit)) {
        c=utf8->toUBytes[0]=b=*source++;
        toULength=1;
        toULimit=U8_COUNT_BYTES(b);
        while(source<sourceLimit) {
            utf8->toUBytes[toULength++]=b=*source++;
            c=(c<<6)+b;
        }
        utf8->toUnicodeStatus=c;
        utf8->toULength=toULength;
        utf8->mode=toULimit;
    }

    /* write back the updated pointers */
    pToUArgs->source=(char *)source;
    pFromUArgs->target=(char *)target;
}